

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderPassBase.cpp
# Opt level: O0

void Diligent::ValidateRenderPassDesc
               (RenderPassDesc *Desc,RenderDeviceInfo *DeviceInfo,GraphicsAdapterInfo *AdapterInfo)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  uint *puVar48;
  AttachmentReference *Args_6;
  bool bVar49;
  SHADING_RATE_CAP_FLAGS SVar50;
  TextureFormatAttribs *Args_4;
  TextureFormatAttribs *Args_12;
  Char *Message;
  char (*pacVar51) [12];
  char (*Args_1) [12];
  long extraout_RDX;
  long extraout_RDX_00;
  long extraout_RDX_01;
  long extraout_RDX_02;
  long extraout_RDX_03;
  long extraout_RDX_04;
  long extraout_RDX_05;
  long extraout_RDX_06;
  long extraout_RDX_07;
  long extraout_RDX_08;
  long extraout_RDX_09;
  long extraout_RDX_10;
  long extraout_RDX_11;
  long extraout_RDX_12;
  long extraout_RDX_13;
  long extraout_RDX_14;
  long extraout_RDX_15;
  long extraout_RDX_16;
  long extraout_RDX_17;
  long extraout_RDX_18;
  long extraout_RDX_19;
  long extraout_RDX_20;
  long extraout_RDX_21;
  long extraout_RDX_22;
  long extraout_RDX_23;
  long extraout_RDX_24;
  long extraout_RDX_25;
  long lVar52;
  long extraout_RDX_26;
  long extraout_RDX_27;
  long extraout_RDX_28;
  long extraout_RDX_29;
  long extraout_RDX_30;
  long extraout_RDX_31;
  char *local_678;
  char *local_670;
  char *local_668;
  char *local_658;
  char *local_650;
  char *local_648;
  char *local_628;
  char *local_608;
  char *local_5f0;
  char *local_5e8;
  char *local_5e0;
  ShadingRateAttachment *local_5d8;
  AttachmentReference *local_598;
  char *local_580;
  char *local_568;
  char *local_560;
  char *local_540;
  char *local_538;
  char *local_530;
  char *local_510;
  char *local_508;
  AttachmentReference *local_4e8;
  char *local_4e0;
  char *local_4c0;
  char *local_4a0;
  char *local_480;
  char *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  char *local_438;
  char *local_428;
  char *local_418;
  char *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  long local_3b8;
  SubpassDependencyDesc *Dependency;
  char *pcStack_3a8;
  Uint32 i_1;
  undefined1 local_3a0 [8];
  string msg;
  SubpassDesc *Subpass_1;
  Uint32 subpass_1;
  char *local_360;
  char *local_358;
  char *local_350;
  uint *local_348;
  Uint32 (*TileSize) [2];
  char *local_320;
  char *local_318;
  char *local_310;
  uint *local_308;
  AttachmentReference *AttchRef_4;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  uint *local_2e0;
  AttachmentReference *RslvAttachmentRef;
  AttachmentReference *RTAttachmentRef;
  char *pcStack_2c8;
  Uint32 attchmnt;
  char *local_2c0;
  uint local_2b8;
  uint local_2b4;
  Uint32 PrsvAttachment;
  Uint32 prsv_attachment;
  TextureFormatAttribs *local_2a8;
  TextureFormatAttribs *FmtAttribs_1;
  undefined1 local_298 [6];
  TEXTURE_FORMAT Fmt_1;
  char *local_278;
  char *local_270;
  char *local_268;
  uint *local_260;
  AttachmentReference *AttchRef_3;
  uint *local_250;
  AttachmentReference *AttchRef_2;
  char *pcStack_240;
  Uint32 rslv_attachment;
  TextureFormatAttribs *local_238;
  TextureFormatAttribs *FmtAttribs;
  undefined1 local_228 [6];
  TEXTURE_FORMAT Fmt;
  char *local_208;
  char *local_200;
  char *local_1f8;
  uint *local_1f0;
  AttachmentReference *AttchRef_1;
  undefined1 local_1e0 [4];
  Uint32 rt_attachment;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  uint *local_1a8;
  AttachmentReference *AttchRef;
  char *pcStack_198;
  Uint32 input_attachment;
  char *local_190;
  char *local_188;
  uint *local_180;
  SubpassDesc *Subpass;
  ShadingRateAttachment *pSStack_170;
  Uint32 subpass;
  ShadingRateAttachment *pShadingRateAttachment;
  char *local_148;
  String local_140;
  char *local_120;
  String local_118;
  char *local_f8 [3];
  String local_e0;
  char *local_c0;
  TextureFormatAttribs *local_b8;
  TextureFormatAttribs *FmtInfo;
  char *local_a8;
  char *local_a0;
  char *local_98;
  TEXTURE_FORMAT *local_90;
  RenderPassAttachmentDesc *Attachment;
  char *pcStack_80;
  Uint32 i;
  char *local_78;
  char *local_70;
  char *local_68;
  byte local_59;
  ShadingRateProperties *pSStack_58;
  bool IsVulkan;
  ShadingRateProperties *SRProps;
  DeviceFeatures *Features;
  GraphicsAdapterInfo *AdapterInfo_local;
  RenderDeviceInfo *DeviceInfo_local;
  RenderPassDesc *Desc_local;
  
  SRProps = (ShadingRateProperties *)&DeviceInfo->Features;
  pSStack_58 = &AdapterInfo->ShadingRate;
  Features = (DeviceFeatures *)AdapterInfo;
  AdapterInfo_local = (GraphicsAdapterInfo *)DeviceInfo;
  DeviceInfo_local = (RenderDeviceInfo *)Desc;
  local_59 = RenderDeviceInfo::IsVulkanDevice(DeviceInfo);
  lVar52 = extraout_RDX;
  if (((DeviceInfo_local->APIVersion).Minor != 0) &&
     (lVar6._0_1_ = (DeviceInfo_local->Features).ComputeShaders,
     lVar6._1_1_ = (DeviceInfo_local->Features).GeometryShaders,
     lVar6._2_1_ = (DeviceInfo_local->Features).Tessellation,
     lVar6._3_1_ = (DeviceInfo_local->Features).MeshShaders,
     lVar6._4_1_ = (DeviceInfo_local->Features).RayTracing,
     lVar6._5_1_ = (DeviceInfo_local->Features).BindlessResources,
     lVar6._6_1_ = (DeviceInfo_local->Features).OcclusionQueries,
     lVar6._7_1_ = (DeviceInfo_local->Features).BinaryOcclusionQueries, lVar6 == 0)) {
    lVar52._0_4_ = DeviceInfo_local->Type;
    lVar52._4_4_ = (DeviceInfo_local->APIVersion).Major;
    if (lVar52 == 0) {
      local_3d0 = "";
    }
    else {
      local_3d0 = *(char **)DeviceInfo_local;
    }
    local_68 = local_3d0;
    LogError<true,char[29],char_const*,char[15],char[23],unsigned_int,char[41]>
              (false,"ValidateRenderPassDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
               ,0x33,(char (*) [29])"Description of render pass \'",&local_68,
               (char (*) [15])"\' is invalid: ",(char (*) [23])0xf50462,
               &(DeviceInfo_local->APIVersion).Minor,
               (char (*) [41])") is not zero, but pAttachments is null.");
    lVar52 = extraout_RDX_00;
  }
  iVar4._0_1_ = (DeviceInfo_local->Features).TimestampQueries;
  iVar4._1_1_ = (DeviceInfo_local->Features).PipelineStatisticsQueries;
  iVar4._2_1_ = (DeviceInfo_local->Features).DurationQueries;
  iVar4._3_1_ = (DeviceInfo_local->Features).DepthBiasClamp;
  if (iVar4 == 0) {
    lVar7._0_4_ = DeviceInfo_local->Type;
    lVar7._4_4_ = (DeviceInfo_local->APIVersion).Major;
    if (lVar7 == 0) {
      local_3d8 = "";
    }
    else {
      local_3d8 = *(char **)DeviceInfo_local;
    }
    local_70 = local_3d8;
    LogError<true,char[29],char_const*,char[15],char[44]>
              (false,"ValidateRenderPassDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
               ,0x3a,(char (*) [29])"Description of render pass \'",&local_70,
               (char (*) [15])"\' is invalid: ",
               (char (*) [44])"render pass must have at least one subpass.");
    lVar52 = extraout_RDX_01;
  }
  lVar8._0_1_ = (DeviceInfo_local->Features).TextureCompressionBC;
  lVar8._1_1_ = (DeviceInfo_local->Features).TextureCompressionETC2;
  lVar8._2_1_ = (DeviceInfo_local->Features).VertexPipelineUAVWritesAndAtomics;
  lVar8._3_1_ = (DeviceInfo_local->Features).PixelUAVWritesAndAtomics;
  lVar8._4_1_ = (DeviceInfo_local->Features).TextureUAVExtendedFormats;
  lVar8._5_1_ = (DeviceInfo_local->Features).ShaderFloat16;
  lVar8._6_1_ = (DeviceInfo_local->Features).ResourceBuffer16BitAccess;
  lVar8._7_1_ = (DeviceInfo_local->Features).UniformBuffer16BitAccess;
  if (lVar8 == 0) {
    lVar9._0_4_ = DeviceInfo_local->Type;
    lVar9._4_4_ = (DeviceInfo_local->APIVersion).Major;
    if (lVar9 == 0) {
      local_3e0 = "";
    }
    else {
      local_3e0 = *(char **)DeviceInfo_local;
    }
    local_78 = local_3e0;
    LogError<true,char[29],char_const*,char[15],char[29]>
              (false,"ValidateRenderPassDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
               ,0x40,(char (*) [29])"Description of render pass \'",&local_78,
               (char (*) [15])"\' is invalid: ",(char (*) [29])"pSubpasses must not be null.");
    lVar52 = extraout_RDX_02;
  }
  iVar5._0_1_ = (DeviceInfo_local->Features).ShaderInputOutput16;
  iVar5._1_1_ = (DeviceInfo_local->Features).ShaderInt8;
  iVar5._2_1_ = (DeviceInfo_local->Features).ResourceBuffer8BitAccess;
  iVar5._3_1_ = (DeviceInfo_local->Features).UniformBuffer8BitAccess;
  if ((iVar5 != 0) &&
     (lVar10._0_1_ = (DeviceInfo_local->Features).NativeFence,
     lVar10._1_1_ = (DeviceInfo_local->Features).TileShaders,
     lVar10._2_1_ = (DeviceInfo_local->Features).TransferQueueTimestampQueries,
     lVar10._3_1_ = (DeviceInfo_local->Features).VariableRateShading,
     lVar10._4_1_ = (DeviceInfo_local->Features).SparseResources,
     lVar10._5_1_ = (DeviceInfo_local->Features).SubpassFramebufferFetch,
     lVar10._6_1_ = (DeviceInfo_local->Features).TextureComponentSwizzle,
     lVar10._7_1_ = (DeviceInfo_local->Features).TextureSubresourceViews, lVar10 == 0)) {
    lVar11._0_4_ = DeviceInfo_local->Type;
    lVar11._4_4_ = (DeviceInfo_local->APIVersion).Major;
    if (lVar11 == 0) {
      local_3e8 = "";
    }
    else {
      local_3e8 = *(char **)DeviceInfo_local;
    }
    pcStack_80 = local_3e8;
    LogError<true,char[29],char_const*,char[15],char[23],unsigned_int,char[42]>
              (false,"ValidateRenderPassDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
               ,0x48,(char (*) [29])"Description of render pass \'",&stack0xffffffffffffff80,
               (char (*) [15])"\' is invalid: ",(char (*) [23])"the dependency count (",
               (uint *)&(DeviceInfo_local->Features).ShaderInputOutput16,
               (char (*) [42])") is not zero, but pDependencies is null.");
    lVar52 = extraout_RDX_03;
  }
  for (Attachment._4_4_ = 0; Attachment._4_4_ < (DeviceInfo_local->APIVersion).Minor;
      Attachment._4_4_ = Attachment._4_4_ + 1) {
    local_90 = (TEXTURE_FORMAT *)
               (*(long *)&(DeviceInfo_local->Features).ComputeShaders +
               (ulong)Attachment._4_4_ * 0x10);
    if (*local_90 == TEX_FORMAT_UNKNOWN) {
      lVar12._0_4_ = DeviceInfo_local->Type;
      lVar12._4_4_ = (DeviceInfo_local->APIVersion).Major;
      if (lVar12 == 0) {
        local_3f0 = "";
      }
      else {
        local_3f0 = *(char **)DeviceInfo_local;
      }
      local_98 = local_3f0;
      LogError<true,char[29],char_const*,char[15],char[26],unsigned_int,char[13]>
                (false,"ValidateRenderPassDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                 ,0x4f,(char (*) [29])"Description of render pass \'",&local_98,
                 (char (*) [15])"\' is invalid: ",(char (*) [26])"the format of attachment ",
                 (uint *)((long)&Attachment + 4),(char (*) [13])" is unknown.");
    }
    if ((char)local_90[1] == TEX_FORMAT_UNKNOWN) {
      lVar13._0_4_ = DeviceInfo_local->Type;
      lVar13._4_4_ = (DeviceInfo_local->APIVersion).Major;
      if (lVar13 == 0) {
        local_3f8 = "";
      }
      else {
        local_3f8 = *(char **)DeviceInfo_local;
      }
      local_a0 = local_3f8;
      LogError<true,char[29],char_const*,char[15],char[32],unsigned_int,char[10]>
                (false,"ValidateRenderPassDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                 ,0x52,(char (*) [29])"Description of render pass \'",&local_a0,
                 (char (*) [15])"\' is invalid: ",(char (*) [32])"the sample count of attachment ",
                 (uint *)((long)&Attachment + 4),(char (*) [10])0xf52529);
    }
    bVar49 = IsPowerOfTwo<unsigned_char>((char)local_90[1]);
    if (!bVar49) {
      lVar14._0_4_ = DeviceInfo_local->Type;
      lVar14._4_4_ = (DeviceInfo_local->APIVersion).Major;
      if (lVar14 == 0) {
        local_400 = "";
      }
      else {
        local_400 = *(char **)DeviceInfo_local;
      }
      local_a8 = local_400;
      FmtInfo._4_4_ = (uint)(byte)(char)local_90[1];
      LogError<true,char[29],char_const*,char[15],char[19],unsigned_int,char[17],unsigned_int,char[22]>
                (false,"ValidateRenderPassDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                 ,0x55,(char (*) [29])"Description of render pass \'",&local_a8,
                 (char (*) [15])"\' is invalid: ",(char (*) [19])0xf503a9,
                 (uint *)((long)&FmtInfo + 4),(char (*) [17])") of attachment ",
                 (uint *)((long)&Attachment + 4),(char (*) [22])" is not power of two.");
    }
    local_b8 = GetTextureFormatAttribs(*local_90);
    lVar52 = extraout_RDX_04;
    if ((local_b8->ComponentType == COMPONENT_TYPE_DEPTH) ||
       (local_b8->ComponentType == COMPONENT_TYPE_DEPTH_STENCIL)) {
      if (((*(undefined4 *)(local_90 + 4) != TEX_FORMAT_R8_SINT) &&
          (((((*(undefined4 *)(local_90 + 4) != 0x80 &&
              (*(undefined4 *)(local_90 + 4) != TEX_FORMAT_RGBA8_SINT)) &&
             (*(undefined4 *)(local_90 + 4) != 0x100)) &&
            ((*(undefined4 *)(local_90 + 4) != 0x2000 && (*(undefined4 *)(local_90 + 4) != 0x4000)))
            ) && (*(undefined4 *)(local_90 + 4) != 0x800)))) &&
         ((((*(undefined4 *)(local_90 + 4) != 0x1000 && (*(undefined4 *)(local_90 + 4) != 0x8000))
           && (*(undefined4 *)(local_90 + 4) != TEX_FORMAT_RGBA32_TYPELESS)) &&
          (((local_59 & 1) == 0 || (*(undefined4 *)(local_90 + 4) != 0x100000)))))) {
        lVar15._0_4_ = DeviceInfo_local->Type;
        lVar15._4_4_ = (DeviceInfo_local->APIVersion).Major;
        if (lVar15 == 0) {
          local_408 = "";
        }
        else {
          local_408 = *(char **)DeviceInfo_local;
        }
        local_c0 = local_408;
        GetResourceStateString_abi_cxx11_
                  (&local_e0,(Diligent *)(ulong)(uint)*(undefined4 *)(local_90 + 4),
                   (RESOURCE_STATE)extraout_RDX_04);
        LogError<true,char[29],char_const*,char[15],char[47],unsigned_int,char[3],std::__cxx11::string,char[14]>
                  (false,"ValidateRenderPassDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                   ,0x67,(char (*) [29])"Description of render pass \'",&local_c0,
                   (char (*) [15])"\' is invalid: ",
                   (char (*) [47])"the initial state of depth-stencil attachment ",
                   (uint *)((long)&Attachment + 4),(char (*) [3])0xe5b074,&local_e0,
                   (char (*) [14])") is invalid.");
        std::__cxx11::string::~string((string *)&local_e0);
        lVar52 = extraout_RDX_05;
      }
      if ((((((*(undefined4 *)(local_90 + 6) != TEX_FORMAT_R8_SINT) &&
             (*(undefined4 *)(local_90 + 6) != 0x80)) &&
            (*(undefined4 *)(local_90 + 6) != TEX_FORMAT_RGBA8_SINT)) &&
           ((*(undefined4 *)(local_90 + 6) != 0x100 && (*(undefined4 *)(local_90 + 6) != 0x2000))))
          && (((*(undefined4 *)(local_90 + 6) != 0x4000 &&
               ((*(undefined4 *)(local_90 + 6) != 0x800 && (*(undefined4 *)(local_90 + 6) != 0x1000)
                ))) && (*(undefined4 *)(local_90 + 6) != 0x8000)))) &&
         (((local_59 & 1) == 0 || (*(undefined4 *)(local_90 + 6) != 0x100000)))) {
        lVar16._0_4_ = DeviceInfo_local->Type;
        lVar16._4_4_ = (DeviceInfo_local->APIVersion).Major;
        if (lVar16 == 0) {
          local_418 = "";
        }
        else {
          local_418 = *(char **)DeviceInfo_local;
        }
        local_f8[0] = local_418;
        GetResourceStateString_abi_cxx11_
                  (&local_118,(Diligent *)(ulong)(uint)*(undefined4 *)(local_90 + 6),
                   (RESOURCE_STATE)lVar52);
        LogError<true,char[29],char_const*,char[15],char[45],unsigned_int,char[3],std::__cxx11::string,char[14]>
                  (false,"ValidateRenderPassDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                   ,0x75,(char (*) [29])"Description of render pass \'",local_f8,
                   (char (*) [15])"\' is invalid: ",
                   (char (*) [45])"the final state of depth-stencil attachment ",
                   (uint *)((long)&Attachment + 4),(char (*) [3])0xe5b074,&local_118,
                   (char (*) [14])") is invalid.");
        std::__cxx11::string::~string((string *)&local_118);
        lVar52 = extraout_RDX_06;
      }
    }
    else {
      if (((((*(undefined4 *)(local_90 + 4) != TEX_FORMAT_RG32_FLOAT) &&
            (*(undefined4 *)(local_90 + 4) != TEX_FORMAT_RGBA8_SINT)) &&
           (*(undefined4 *)(local_90 + 4) != 0x100)) &&
          (((*(undefined4 *)(local_90 + 4) != 0x2000 && (*(undefined4 *)(local_90 + 4) != 0x4000))
           && ((*(undefined4 *)(local_90 + 4) != 0x1000 &&
               ((*(undefined4 *)(local_90 + 4) != 0x800 && (*(undefined4 *)(local_90 + 4) != 0x8000)
                ))))))) &&
         (((*(undefined4 *)(local_90 + 4) != 0x10000 &&
           ((*(undefined4 *)(local_90 + 4) != 0x200000 &&
            (*(undefined4 *)(local_90 + 4) != TEX_FORMAT_RGBA32_TYPELESS)))) &&
          (((local_59 & 1) == 0 || (*(undefined4 *)(local_90 + 4) != 0x100000)))))) {
        lVar17._0_4_ = DeviceInfo_local->Type;
        lVar17._4_4_ = (DeviceInfo_local->APIVersion).Major;
        if (lVar17 == 0) {
          local_428 = "";
        }
        else {
          local_428 = *(char **)DeviceInfo_local;
        }
        local_120 = local_428;
        GetResourceStateString_abi_cxx11_
                  (&local_140,(Diligent *)(ulong)(uint)*(undefined4 *)(local_90 + 4),
                   (RESOURCE_STATE)extraout_RDX_04);
        LogError<true,char[29],char_const*,char[15],char[39],unsigned_int,char[3],std::__cxx11::string,char[14]>
                  (false,"ValidateRenderPassDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                   ,0x87,(char (*) [29])"Description of render pass \'",&local_120,
                   (char (*) [15])"\' is invalid: ",
                   (char (*) [39])"the initial state of color attachment ",
                   (uint *)((long)&Attachment + 4),(char (*) [3])0xe5b074,&local_140,
                   (char (*) [14])") is invalid.");
        std::__cxx11::string::~string((string *)&local_140);
        lVar52 = extraout_RDX_07;
      }
      if ((((((*(undefined4 *)(local_90 + 6) != TEX_FORMAT_RG32_FLOAT) &&
             (*(undefined4 *)(local_90 + 6) != TEX_FORMAT_RGBA8_SINT)) &&
            (*(undefined4 *)(local_90 + 6) != 0x100)) &&
           ((*(undefined4 *)(local_90 + 6) != 0x2000 && (*(undefined4 *)(local_90 + 6) != 0x4000))))
          && ((*(undefined4 *)(local_90 + 6) != 0x1000 &&
              ((*(undefined4 *)(local_90 + 6) != 0x800 && (*(undefined4 *)(local_90 + 6) != 0x8000))
              )))) &&
         ((*(undefined4 *)(local_90 + 6) != 0x10000 &&
          ((*(undefined4 *)(local_90 + 6) != 0x200000 &&
           (((local_59 & 1) == 0 || (*(undefined4 *)(local_90 + 6) != 0x100000)))))))) {
        lVar18._0_4_ = DeviceInfo_local->Type;
        lVar18._4_4_ = (DeviceInfo_local->APIVersion).Major;
        if (lVar18 == 0) {
          local_438 = "";
        }
        else {
          local_438 = *(char **)DeviceInfo_local;
        }
        local_148 = local_438;
        GetResourceStateString_abi_cxx11_
                  ((String *)&pShadingRateAttachment,
                   (Diligent *)(ulong)(uint)*(undefined4 *)(local_90 + 6),(RESOURCE_STATE)lVar52);
        LogError<true,char[29],char_const*,char[15],char[37],unsigned_int,char[3],std::__cxx11::string,char[14]>
                  (false,"ValidateRenderPassDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                   ,0x96,(char (*) [29])"Description of render pass \'",&local_148,
                   (char (*) [15])"\' is invalid: ",
                   (char (*) [37])"the final state of color attachment ",
                   (uint *)((long)&Attachment + 4),(char (*) [3])0xe5b074,
                   (String *)&pShadingRateAttachment,(char (*) [14])") is invalid.");
        std::__cxx11::string::~string((string *)&pShadingRateAttachment);
        lVar52 = extraout_RDX_08;
      }
    }
  }
  pSStack_170 = (ShadingRateAttachment *)0x0;
  for (Subpass._4_4_ = 0; uVar1._0_1_ = (DeviceInfo_local->Features).TimestampQueries,
      uVar1._1_1_ = (DeviceInfo_local->Features).PipelineStatisticsQueries,
      uVar1._2_1_ = (DeviceInfo_local->Features).DurationQueries,
      uVar1._3_1_ = (DeviceInfo_local->Features).DepthBiasClamp, Subpass._4_4_ < uVar1;
      Subpass._4_4_ = Subpass._4_4_ + 1) {
    local_180 = (uint *)(*(long *)&(DeviceInfo_local->Features).TextureCompressionBC +
                        (ulong)Subpass._4_4_ * 0x48);
    if ((*local_180 != 0) && (*(long *)(local_180 + 2) == 0)) {
      lVar19._0_4_ = DeviceInfo_local->Type;
      lVar19._4_4_ = (DeviceInfo_local->APIVersion).Major;
      if (lVar19 == 0) {
        local_448 = "";
      }
      else {
        local_448 = *(char **)DeviceInfo_local;
      }
      local_188 = local_448;
      LogError<true,char[29],char_const*,char[15],char[29],unsigned_int,char[14],unsigned_int,char[47]>
                (false,"ValidateRenderPassDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                 ,0xa2,(char (*) [29])"Description of render pass \'",&local_188,
                 (char (*) [15])"\' is invalid: ",(char (*) [29])"the input attachment count (",
                 local_180,(char (*) [14])") of subpass ",(uint *)((long)&Subpass + 4),
                 (char (*) [47])" is not zero, while pInputAttachments is null.");
      lVar52 = extraout_RDX_09;
    }
    if ((local_180[4] != 0) && (*(long *)(local_180 + 6) == 0)) {
      lVar20._0_4_ = DeviceInfo_local->Type;
      lVar20._4_4_ = (DeviceInfo_local->APIVersion).Major;
      if (lVar20 == 0) {
        local_450 = "";
      }
      else {
        local_450 = *(char **)DeviceInfo_local;
      }
      local_190 = local_450;
      LogError<true,char[29],char_const*,char[15],char[37],unsigned_int,char[14],unsigned_int,char[54]>
                (false,"ValidateRenderPassDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                 ,0xa7,(char (*) [29])"Description of render pass \'",&local_190,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [37])"the render target attachment count (",local_180 + 4,
                 (char (*) [14])") of subpass ",(uint *)((long)&Subpass + 4),
                 (char (*) [54])" is not zero, while pRenderTargetAttachments is null.");
      lVar52 = extraout_RDX_10;
    }
    if ((local_180[0xc] != 0) && (*(long *)(local_180 + 0xe) == 0)) {
      lVar21._0_4_ = DeviceInfo_local->Type;
      lVar21._4_4_ = (DeviceInfo_local->APIVersion).Major;
      if (lVar21 == 0) {
        local_458 = "";
      }
      else {
        local_458 = *(char **)DeviceInfo_local;
      }
      pcStack_198 = local_458;
      LogError<true,char[29],char_const*,char[15],char[32],unsigned_int,char[14],unsigned_int,char[50]>
                (false,"ValidateRenderPassDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                 ,0xac,(char (*) [29])"Description of render pass \'",&stack0xfffffffffffffe68,
                 (char (*) [15])"\' is invalid: ",(char (*) [32])"the preserve attachment count (",
                 local_180 + 0xc,(char (*) [14])") of subpass ",(uint *)((long)&Subpass + 4),
                 (char (*) [50])" is not zero, while pPreserveAttachments is null.");
      lVar52 = extraout_RDX_11;
    }
    for (AttchRef._4_4_ = 0; AttchRef._4_4_ < *local_180; AttchRef._4_4_ = AttchRef._4_4_ + 1) {
      local_1a8 = (uint *)(*(long *)(local_180 + 2) + (ulong)AttchRef._4_4_ * 8);
      if (*local_1a8 != 0xffffffff) {
        if ((DeviceInfo_local->APIVersion).Minor <= *local_1a8) {
          lVar22._0_4_ = DeviceInfo_local->Type;
          lVar22._4_4_ = (DeviceInfo_local->APIVersion).Major;
          if (lVar22 == 0) {
            local_460 = "";
          }
          else {
            local_460 = *(char **)DeviceInfo_local;
          }
          local_1b0 = local_460;
          LogError<true,char[29],char_const*,char[15],char[23],unsigned_int,char[33],unsigned_int,char[13],unsigned_int,char[47],unsigned_int,char[3]>
                    (false,"ValidateRenderPassDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                     ,0xbc,(char (*) [29])"Description of render pass \'",&local_1b0,
                     (char (*) [15])"\' is invalid: ",(char (*) [23])"the attachment index (",
                     local_1a8,(char (*) [33])") of input attachment reference ",
                     (uint *)((long)&AttchRef + 4),(char (*) [13])0xf547dd,
                     (uint *)((long)&Subpass + 4),
                     (char (*) [47])" must be less than the number of attachments (",
                     &(DeviceInfo_local->APIVersion).Minor,(char (*) [3])0xf65ced);
          lVar52 = extraout_RDX_12;
        }
        puVar48 = local_1a8;
        if ((local_1a8[1] != 0x8000) && (((local_59 & 1) == 0 || (local_1a8[1] != 0x100000)))) {
          lVar23._0_4_ = DeviceInfo_local->Type;
          lVar23._4_4_ = (DeviceInfo_local->APIVersion).Major;
          if (lVar23 == 0) {
            local_480 = "";
          }
          else {
            local_480 = *(char **)DeviceInfo_local;
          }
          local_1b8 = local_480;
          local_1c0 = "INPUT_ATTACHMENT";
          if ((local_59 & 1) != 0) {
            local_1c0 = "INPUT_ATTACHMENT or COMMON";
          }
          GetResourceStateString_abi_cxx11_
                    ((String *)local_1e0,(Diligent *)(ulong)local_1a8[1],
                     (RESOURCE_STATE)CONCAT71((int7)((ulong)lVar52 >> 8),local_59));
          LogError<true,char[29],char_const*,char[15],char[23],unsigned_int,char[44],unsigned_int,char[13],char_const*,char[32],std::__cxx11::string>
                    (false,"ValidateRenderPassDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                     ,0xc3,(char (*) [29])"Description of render pass \'",&local_1b8,
                     (char (*) [15])"\' is invalid: ",(char (*) [23])"attachment with index ",
                     puVar48,(char (*) [44])" referenced as input attachment in subpass ",
                     (uint *)((long)&Subpass + 4),(char (*) [13])" must be in ",&local_1c0,
                     (char (*) [32])0xf54eaf,(String *)local_1e0);
          std::__cxx11::string::~string((string *)local_1e0);
          lVar52 = extraout_RDX_13;
        }
      }
    }
    for (AttchRef_1._4_4_ = 0; AttchRef_1._4_4_ < local_180[4];
        AttchRef_1._4_4_ = AttchRef_1._4_4_ + 1) {
      local_1f0 = (uint *)(*(long *)(local_180 + 6) + (ulong)AttchRef_1._4_4_ * 8);
      if (*local_1f0 != 0xffffffff) {
        if ((DeviceInfo_local->APIVersion).Minor <= *local_1f0) {
          lVar24._0_4_ = DeviceInfo_local->Type;
          lVar24._4_4_ = (DeviceInfo_local->APIVersion).Major;
          if (lVar24 == 0) {
            local_4a0 = "";
          }
          else {
            local_4a0 = *(char **)DeviceInfo_local;
          }
          local_1f8 = local_4a0;
          LogError<true,char[29],char_const*,char[15],char[23],unsigned_int,char[41],unsigned_int,char[13],unsigned_int,char[47],unsigned_int,char[3]>
                    (false,"ValidateRenderPassDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                     ,0xd4,(char (*) [29])"Description of render pass \'",&local_1f8,
                     (char (*) [15])"\' is invalid: ",(char (*) [23])"the attachment index (",
                     local_1f0,(char (*) [41])") of render target attachment reference ",
                     (uint *)((long)&AttchRef_1 + 4),(char (*) [13])0xf547dd,
                     (uint *)((long)&Subpass + 4),
                     (char (*) [47])" must be less than the number of attachments (",
                     &(DeviceInfo_local->APIVersion).Minor,(char (*) [3])0xf65ced);
          lVar52 = extraout_RDX_14;
        }
        puVar48 = local_1f0;
        if ((local_1f0[1] != 0x10) && (((local_59 & 1) == 0 || (local_1f0[1] != 0x100000)))) {
          lVar25._0_4_ = DeviceInfo_local->Type;
          lVar25._4_4_ = (DeviceInfo_local->APIVersion).Major;
          if (lVar25 == 0) {
            local_4c0 = "";
          }
          else {
            local_4c0 = *(char **)DeviceInfo_local;
          }
          local_200 = local_4c0;
          local_208 = "RENDER_TARGET";
          if ((local_59 & 1) != 0) {
            local_208 = "RENDER_TARGET or COMMON";
          }
          GetResourceStateString_abi_cxx11_
                    ((String *)local_228,(Diligent *)(ulong)local_1f0[1],
                     (RESOURCE_STATE)CONCAT71((int7)((ulong)lVar52 >> 8),local_59));
          LogError<true,char[29],char_const*,char[15],char[23],unsigned_int,char[52],unsigned_int,char[13],char_const*,char[32],std::__cxx11::string>
                    (false,"ValidateRenderPassDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                     ,0xdb,(char (*) [29])"Description of render pass \'",&local_200,
                     (char (*) [15])"\' is invalid: ",(char (*) [23])"attachment with index ",
                     puVar48,(char (*) [52])" referenced as render target attachment in subpass ",
                     (uint *)((long)&Subpass + 4),(char (*) [13])" must be in ",&local_208,
                     (char (*) [32])0xf54eaf,(String *)local_228);
          std::__cxx11::string::~string((string *)local_228);
        }
        FmtAttribs._6_2_ =
             *(TEXTURE_FORMAT *)
              (*(long *)&(DeviceInfo_local->Features).ComputeShaders + (ulong)*local_1f0 * 0x10);
        local_238 = GetTextureFormatAttribs(FmtAttribs._6_2_);
        if (((local_238->ComponentType == COMPONENT_TYPE_DEPTH) ||
            (local_238->ComponentType == COMPONENT_TYPE_DEPTH_STENCIL)) ||
           (lVar52 = extraout_RDX_15, local_238->ComponentType == COMPONENT_TYPE_COMPRESSED)) {
          lVar26._0_4_ = DeviceInfo_local->Type;
          lVar26._4_4_ = (DeviceInfo_local->APIVersion).Major;
          if (lVar26 == 0) {
            local_4e0 = "";
          }
          else {
            local_4e0 = *(char **)DeviceInfo_local;
          }
          pcStack_240 = local_4e0;
          LogError<true,char[29],char_const*,char[15],char[23],unsigned_int,char[52],unsigned_int,char[14],char_const*,char[45]>
                    (false,"ValidateRenderPassDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                     ,0xe5,(char (*) [29])"Description of render pass \'",&stack0xfffffffffffffdc0,
                     (char (*) [15])"\' is invalid: ",(char (*) [23])"attachment with index ",
                     local_1f0,(char (*) [52])" referenced as render target attachment in subpass ",
                     (uint *)((long)&Subpass + 4),(char (*) [14])" uses format ",&local_238->Name,
                     (char (*) [45])", which is not a valid render target format.");
          lVar52 = extraout_RDX_16;
        }
      }
    }
    if (*(long *)(local_180 + 8) != 0) {
      for (AttchRef_2._4_4_ = 0; AttchRef_2._4_4_ < local_180[4];
          AttchRef_2._4_4_ = AttchRef_2._4_4_ + 1) {
        local_250 = (uint *)(*(long *)(local_180 + 8) + (ulong)AttchRef_2._4_4_ * 8);
        if ((*local_250 != 0xffffffff) && ((DeviceInfo_local->APIVersion).Minor <= *local_250)) {
          lVar27._0_4_ = DeviceInfo_local->Type;
          lVar27._4_4_ = (DeviceInfo_local->APIVersion).Major;
          if (lVar27 == 0) {
            local_4e8 = (AttachmentReference *)0xe30c4c;
          }
          else {
            local_4e8 = *(AttachmentReference **)DeviceInfo_local;
          }
          AttchRef_3 = local_4e8;
          LogError<true,char[29],char_const*,char[15],char[23],unsigned_int,char[35],unsigned_int,char[13],unsigned_int,char[47],unsigned_int,char[3]>
                    (false,"ValidateRenderPassDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                     ,0xf8,(char (*) [29])"Description of render pass \'",(char **)&AttchRef_3,
                     (char (*) [15])"\' is invalid: ",(char (*) [23])"the attachment index (",
                     local_250,(char (*) [35])") of resolve attachment reference ",
                     (uint *)((long)&AttchRef_2 + 4),(char (*) [13])0xf547dd,
                     (uint *)((long)&Subpass + 4),
                     (char (*) [47])" must be less than the number of attachments (",
                     &(DeviceInfo_local->APIVersion).Minor,(char (*) [3])0xf65ced);
          lVar52 = extraout_RDX_17;
        }
      }
    }
    if ((*(long *)(local_180 + 10) != 0) &&
       (local_260 = *(uint **)(local_180 + 10), *local_260 != 0xffffffff)) {
      if ((DeviceInfo_local->APIVersion).Minor <= *local_260) {
        lVar28._0_4_ = DeviceInfo_local->Type;
        lVar28._4_4_ = (DeviceInfo_local->APIVersion).Major;
        if (lVar28 == 0) {
          local_508 = "";
        }
        else {
          local_508 = *(char **)DeviceInfo_local;
        }
        local_268 = local_508;
        LogError<true,char[29],char_const*,char[15],char[23],unsigned_int,char[52],unsigned_int,char[47],unsigned_int,char[3]>
                  (false,"ValidateRenderPassDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                   ,0x109,(char (*) [29])"Description of render pass \'",&local_268,
                   (char (*) [15])"\' is invalid: ",(char (*) [23])"the attachment index (",
                   local_260,(char (*) [52])") of depth-stencil attachment reference of subpass ",
                   (uint *)((long)&Subpass + 4),
                   (char (*) [47])" must be less than the number of attachments (",
                   &(DeviceInfo_local->APIVersion).Minor,(char (*) [3])0xf65ced);
        lVar52 = extraout_RDX_18;
      }
      puVar48 = local_260;
      if (((local_260[1] != 0x80) && (local_260[1] != 0x40)) &&
         (((local_59 & 1) == 0 || (local_260[1] != 0x100000)))) {
        lVar29._0_4_ = DeviceInfo_local->Type;
        lVar29._4_4_ = (DeviceInfo_local->APIVersion).Major;
        if (lVar29 == 0) {
          local_510 = "";
        }
        else {
          local_510 = *(char **)DeviceInfo_local;
        }
        local_270 = local_510;
        local_278 = "DEPTH_READ or DEPTH_WRITE";
        if ((local_59 & 1) != 0) {
          local_278 = "DEPTH_READ, DEPTH_WRITE or COMMON";
        }
        GetResourceStateString_abi_cxx11_
                  ((String *)local_298,(Diligent *)(ulong)local_260[1],
                   (RESOURCE_STATE)CONCAT71((int7)((ulong)lVar52 >> 8),local_59));
        LogError<true,char[29],char_const*,char[15],char[23],unsigned_int,char[52],unsigned_int,char[13],char_const*,char[32],std::__cxx11::string>
                  (false,"ValidateRenderPassDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                   ,0x110,(char (*) [29])"Description of render pass \'",&local_270,
                   (char (*) [15])"\' is invalid: ",(char (*) [23])"attachment with index ",puVar48,
                   (char (*) [52])" referenced as depth stencil attachment in subpass ",
                   (uint *)((long)&Subpass + 4),(char (*) [13])" must be in ",&local_278,
                   (char (*) [32])0xf54eaf,(String *)local_298);
        std::__cxx11::string::~string((string *)local_298);
      }
      FmtAttribs_1._6_2_ =
           *(TEXTURE_FORMAT *)
            (*(long *)&(DeviceInfo_local->Features).ComputeShaders + (ulong)*local_260 * 0x10);
      local_2a8 = GetTextureFormatAttribs(FmtAttribs_1._6_2_);
      lVar52 = extraout_RDX_19;
      if ((local_2a8->ComponentType != COMPONENT_TYPE_DEPTH) &&
         (local_2a8->ComponentType != COMPONENT_TYPE_DEPTH_STENCIL)) {
        lVar30._0_4_ = DeviceInfo_local->Type;
        lVar30._4_4_ = (DeviceInfo_local->APIVersion).Major;
        if (lVar30 == 0) {
          local_530 = "";
        }
        else {
          local_530 = *(char **)DeviceInfo_local;
        }
        _PrsvAttachment = local_530;
        LogError<true,char[29],char_const*,char[15],char[23],unsigned_int,char[52],unsigned_int,char[14],char_const*,char[44]>
                  (false,"ValidateRenderPassDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                   ,0x119,(char (*) [29])"Description of render pass \'",(char **)&PrsvAttachment,
                   (char (*) [15])"\' is invalid: ",(char (*) [23])"attachment with index ",
                   local_260,(char (*) [52])" referenced as depth-stencil attachment in subpass ",
                   (uint *)((long)&Subpass + 4),(char (*) [14])" uses format ",&local_2a8->Name,
                   (char (*) [44])", which is not a valid depth buffer format.");
        lVar52 = extraout_RDX_20;
      }
    }
    for (local_2b4 = 0; local_2b4 < local_180[0xc]; local_2b4 = local_2b4 + 1) {
      local_2b8 = *(uint *)(*(long *)(local_180 + 0xe) + (ulong)local_2b4 * 4);
      if (local_2b8 == 0xffffffff) {
        lVar31._0_4_ = DeviceInfo_local->Type;
        lVar31._4_4_ = (DeviceInfo_local->APIVersion).Major;
        if (lVar31 == 0) {
          local_538 = "";
        }
        else {
          local_538 = *(char **)DeviceInfo_local;
        }
        local_2c0 = local_538;
        LogError<true,char[29],char_const*,char[15],char[55],unsigned_int,char[13],unsigned_int,char[23]>
                  (false,"ValidateRenderPassDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                   ,0x126,(char (*) [29])"Description of render pass \'",&local_2c0,
                   (char (*) [15])"\' is invalid: ",
                   (char (*) [55])"the attachment index of preserve attachment reference ",
                   &local_2b4,(char (*) [13])0xf547dd,(uint *)((long)&Subpass + 4),
                   (char (*) [23])0xf54c8d);
        lVar52 = extraout_RDX_21;
      }
      if ((DeviceInfo_local->APIVersion).Minor <= local_2b8) {
        lVar32._0_4_ = DeviceInfo_local->Type;
        lVar32._4_4_ = (DeviceInfo_local->APIVersion).Major;
        if (lVar32 == 0) {
          local_540 = "";
        }
        else {
          local_540 = *(char **)DeviceInfo_local;
        }
        pcStack_2c8 = local_540;
        LogError<true,char[29],char_const*,char[15],char[23],unsigned_int,char[36],unsigned_int,char[13],unsigned_int,char[37],unsigned_int,char[3]>
                  (false,"ValidateRenderPassDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                   ,300,(char (*) [29])"Description of render pass \'",&stack0xfffffffffffffd38,
                   (char (*) [15])"\' is invalid: ",(char (*) [23])"the attachment index (",
                   &local_2b8,(char (*) [36])") of preserve attachment reference ",&local_2b4,
                   (char (*) [13])0xf547dd,(uint *)((long)&Subpass + 4),
                   (char (*) [37])" exceeds the number of attachments (",
                   &(DeviceInfo_local->APIVersion).Minor,(char (*) [3])0xf65ced);
        lVar52 = extraout_RDX_22;
      }
    }
    if (*(long *)(local_180 + 8) != 0) {
      for (RTAttachmentRef._4_4_ = 0; RTAttachmentRef._4_4_ < local_180[4];
          RTAttachmentRef._4_4_ = RTAttachmentRef._4_4_ + 1) {
        RslvAttachmentRef =
             (AttachmentReference *)(*(long *)(local_180 + 6) + (ulong)RTAttachmentRef._4_4_ * 8);
        local_2e0 = (uint *)(*(long *)(local_180 + 8) + (ulong)RTAttachmentRef._4_4_ * 8);
        if ((*local_2e0 != 0xffffffff) && (RslvAttachmentRef->AttachmentIndex == 0xffffffff)) {
          lVar33._0_4_ = DeviceInfo_local->Type;
          lVar33._4_4_ = (DeviceInfo_local->APIVersion).Major;
          if (lVar33 == 0) {
            local_560 = "";
          }
          else {
            local_560 = *(char **)DeviceInfo_local;
          }
          local_2e8 = local_560;
          LogError<true,char[29],char_const*,char[15],char[32],unsigned_int,char[47],unsigned_int,char[102]>
                    (false,"ValidateRenderPassDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                     ,0x13c,(char (*) [29])"Description of render pass \'",&local_2e8,
                     (char (*) [15])"\' is invalid: ",
                     (char (*) [32])"pResolveAttachments of subpass ",(uint *)((long)&Subpass + 4),
                     (char (*) [47])" is not null and resolve attachment reference ",
                     (uint *)((long)&RTAttachmentRef + 4),
                     (char (*) [102])
                     " is not ATTACHMENT_UNUSED, but corresponding render target attachment reference is ATTACHMENT_UNUSED."
                    );
          lVar52 = extraout_RDX_23;
        }
        if ((*local_2e0 != 0xffffffff) &&
           (*(char *)(*(long *)&(DeviceInfo_local->Features).ComputeShaders +
                      (ulong)RslvAttachmentRef->AttachmentIndex * 0x10 + 2) == '\x01')) {
          lVar34._0_4_ = DeviceInfo_local->Type;
          lVar34._4_4_ = (DeviceInfo_local->APIVersion).Major;
          if (lVar34 == 0) {
            local_568 = "";
          }
          else {
            local_568 = *(char **)DeviceInfo_local;
          }
          local_2f0 = local_568;
          LogError<true,char[29],char_const*,char[15],char[35],unsigned_int,char[15],char[23],unsigned_int,char[13],unsigned_int,char[72]>
                    (false,"ValidateRenderPassDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                     ,0x146,(char (*) [29])"Description of render pass \'",&local_2f0,
                     (char (*) [15])"\' is invalid: ",
                     (char (*) [35])"Render target attachment at index ",
                     &RslvAttachmentRef->AttachmentIndex,(char (*) [15])" referenced by",
                     (char (*) [23])0xf54c27,(uint *)((long)&RTAttachmentRef + 4),
                     (char (*) [13])0xf547dd,(uint *)((long)&Subpass + 4),
                     (char (*) [72])
                     " is used as the source of resolve operation, but its sample count is 1.");
          lVar52 = extraout_RDX_24;
        }
        if ((*local_2e0 != 0xffffffff) &&
           (*(char *)(*(long *)&(DeviceInfo_local->Features).ComputeShaders +
                      (ulong)*local_2e0 * 0x10 + 2) != '\x01')) {
          lVar35._0_4_ = DeviceInfo_local->Type;
          lVar35._4_4_ = (DeviceInfo_local->APIVersion).Major;
          if (lVar35 == 0) {
            local_580 = "";
          }
          else {
            local_580 = *(char **)DeviceInfo_local;
          }
          local_2f8 = local_580;
          LogError<true,char[29],char_const*,char[15],char[29],unsigned_int,char[15],char[23],unsigned_int,char[13],unsigned_int,char[30]>
                    (false,"ValidateRenderPassDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                     ,0x150,(char (*) [29])"Description of render pass \'",&local_2f8,
                     (char (*) [15])"\' is invalid: ",(char (*) [29])"Resolve attachment at index ",
                     local_2e0,(char (*) [15])" referenced by",(char (*) [23])0xf54c27,
                     (uint *)((long)&RTAttachmentRef + 4),(char (*) [13])0xf547dd,
                     (uint *)((long)&Subpass + 4),(char (*) [30])" must have sample count of 1.");
          lVar52 = extraout_RDX_25;
        }
        if (((RslvAttachmentRef->AttachmentIndex != 0xffffffff) && (*local_2e0 != 0xffffffff)) &&
           (lVar52 = (ulong)*local_2e0 * 0x10,
           *(short *)(*(long *)&(DeviceInfo_local->Features).ComputeShaders +
                     (ulong)RslvAttachmentRef->AttachmentIndex * 0x10) !=
           *(short *)(*(long *)&(DeviceInfo_local->Features).ComputeShaders + lVar52))) {
          lVar36._0_4_ = DeviceInfo_local->Type;
          lVar36._4_4_ = (DeviceInfo_local->APIVersion).Major;
          if (lVar36 == 0) {
            local_598 = (AttachmentReference *)0xe30c4c;
          }
          else {
            local_598 = *(AttachmentReference **)DeviceInfo_local;
          }
          AttchRef_4 = local_598;
          Args_4 = GetTextureFormatAttribs
                             (*(TEXTURE_FORMAT *)
                               (*(long *)&(DeviceInfo_local->Features).ComputeShaders +
                               (ulong)RslvAttachmentRef->AttachmentIndex * 0x10));
          Args_6 = RslvAttachmentRef;
          Args_12 = GetTextureFormatAttribs
                              (*(TEXTURE_FORMAT *)
                                (*(long *)&(DeviceInfo_local->Features).ComputeShaders +
                                (ulong)*local_2e0 * 0x10));
          LogError<true,char[29],char_const*,char[15],char[13],char_const*,char[40],unsigned_int,char[37],unsigned_int,char[13],unsigned_int,char[29],char_const*,char[52],unsigned_int,char[2]>
                    (false,"ValidateRenderPassDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                     ,0x160,(char (*) [29])"Description of render pass \'",(char **)&AttchRef_4,
                     (char (*) [15])"\' is invalid: ",(char (*) [13])"The format (",&Args_4->Name,
                     (char (*) [40])") of render target attachment at index ",
                     &Args_6->AttachmentIndex,(char (*) [37])" referenced by attachment reference ",
                     (uint *)((long)&RTAttachmentRef + 4),(char (*) [13])0xf547dd,
                     (uint *)((long)&Subpass + 4),(char (*) [29])" does not match the format (",
                     &Args_12->Name,
                     (char (*) [52])") of the corresponding resolve attachment at index ",local_2e0,
                     (char (*) [2])0xf544de);
          lVar52 = extraout_RDX_26;
        }
      }
    }
    if (*(long *)(local_180 + 0x10) != 0) {
      if (pSStack_170 == (ShadingRateAttachment *)0x0) {
        local_5d8 = *(ShadingRateAttachment **)(local_180 + 0x10);
      }
      else {
        local_5d8 = pSStack_170;
      }
      pSStack_170 = local_5d8;
      local_308 = *(uint **)(local_180 + 0x10);
      if (*local_308 != 0xffffffff) {
        if ((DeviceInfo_local->APIVersion).Minor <= *local_308) {
          lVar37._0_4_ = DeviceInfo_local->Type;
          lVar37._4_4_ = (DeviceInfo_local->APIVersion).Major;
          if (lVar37 == 0) {
            local_5e0 = "";
          }
          else {
            local_5e0 = *(char **)DeviceInfo_local;
          }
          local_310 = local_5e0;
          LogError<true,char[29],char_const*,char[15],char[23],unsigned_int,char[51],unsigned_int,char[47],unsigned_int,char[3]>
                    (false,"ValidateRenderPassDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                     ,0x16e,(char (*) [29])"Description of render pass \'",&local_310,
                     (char (*) [15])"\' is invalid: ",(char (*) [23])"the attachment index (",
                     local_308,(char (*) [51])") of shading rate attachment reference of subpass ",
                     (uint *)((long)&Subpass + 4),
                     (char (*) [47])" must be less than the number of attachments (",
                     &(DeviceInfo_local->APIVersion).Minor,(char (*) [3])0xf65ced);
          lVar52 = extraout_RDX_27;
        }
        if (*(char *)((long)SRProps->MinTileSize + 7) == '\0') {
          lVar38._0_4_ = DeviceInfo_local->Type;
          lVar38._4_4_ = (DeviceInfo_local->APIVersion).Major;
          if (lVar38 == 0) {
            local_5e8 = "";
          }
          else {
            local_5e8 = *(char **)DeviceInfo_local;
          }
          local_318 = local_5e8;
          LogError<true,char[29],char_const*,char[15],char[9],unsigned_int,char[87]>
                    (false,"ValidateRenderPassDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                     ,0x172,(char (*) [29])"Description of render pass \'",&local_318,
                     (char (*) [15])"\' is invalid: ",(char (*) [9])0xf547e1,
                     (uint *)((long)&Subpass + 4),
                     (char (*) [87])
                     " uses a shading rate attachment, but VariableRateShading device feature is not enabled"
                    );
          lVar52 = extraout_RDX_28;
        }
        puVar48 = local_308;
        if (local_308[1] != 0x200000) {
          lVar39._0_4_ = DeviceInfo_local->Type;
          lVar39._4_4_ = (DeviceInfo_local->APIVersion).Major;
          if (lVar39 == 0) {
            local_5f0 = "";
          }
          else {
            local_5f0 = *(char **)DeviceInfo_local;
          }
          local_320 = local_5f0;
          GetResourceStateString_abi_cxx11_
                    ((String *)&TileSize,(Diligent *)(ulong)local_308[1],(RESOURCE_STATE)lVar52);
          LogError<true,char[29],char_const*,char[15],char[23],unsigned_int,char[51],unsigned_int,char[56],std::__cxx11::string>
                    (false,"ValidateRenderPassDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                     ,0x177,(char (*) [29])"Description of render pass \'",&local_320,
                     (char (*) [15])"\' is invalid: ",(char (*) [23])"attachment with index ",
                     puVar48,(char (*) [51])" referenced as shading rate attachment in subpass ",
                     (uint *)((long)&Subpass + 4),
                     (char (*) [56])" must be in SHADING_RATE state, but specified state is ",
                     (String *)&TileSize);
          std::__cxx11::string::~string((string *)&TileSize);
          lVar52 = extraout_RDX_29;
        }
        local_348 = (uint *)(*(long *)(local_180 + 0x10) + 8);
        if ((*local_348 != 0) || (*(int *)(*(long *)(local_180 + 0x10) + 0xc) != 0)) {
          if ((*local_348 < pSStack_58->MinTileSize[0]) || (pSStack_58->MaxTileSize[0] < *local_348)
             ) {
            lVar40._0_4_ = DeviceInfo_local->Type;
            lVar40._4_4_ = (DeviceInfo_local->APIVersion).Major;
            if (lVar40 == 0) {
              local_608 = "";
            }
            else {
              local_608 = *(char **)DeviceInfo_local;
            }
            local_350 = local_608;
            LogError<true,char[29],char_const*,char[15],char[9],unsigned_int,char[47],unsigned_int,char[36],unsigned_int,char[3],unsigned_int,char[67]>
                      (false,"ValidateRenderPassDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                       ,0x181,(char (*) [29])"Description of render pass \'",&local_350,
                       (char (*) [15])"\' is invalid: ",(char (*) [9])0xf547e1,
                       (uint *)((long)&Subpass + 4),
                       (char (*) [47])" uses shading rate attachment with tile width ",local_348,
                       (char (*) [36])" that is not in the allowed range [",pSStack_58->MinTileSize,
                       (char (*) [3])0xf64f1c,pSStack_58->MaxTileSize,
                       (char (*) [67])
                       "]. Check MinTileSize/MaxTileSize members of ShadingRateProperties.");
          }
          if ((local_348[1] < pSStack_58->MinTileSize[1]) ||
             (pSStack_58->MaxTileSize[1] < local_348[1])) {
            lVar41._0_4_ = DeviceInfo_local->Type;
            lVar41._4_4_ = (DeviceInfo_local->APIVersion).Major;
            if (lVar41 == 0) {
              local_628 = "";
            }
            else {
              local_628 = *(char **)DeviceInfo_local;
            }
            local_358 = local_628;
            LogError<true,char[29],char_const*,char[15],char[9],unsigned_int,char[48],unsigned_int,char[36],unsigned_int,char[3],unsigned_int,char[67]>
                      (false,"ValidateRenderPassDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                       ,0x187,(char (*) [29])"Description of render pass \'",&local_358,
                       (char (*) [15])"\' is invalid: ",(char (*) [9])0xf547e1,
                       (uint *)((long)&Subpass + 4),
                       (char (*) [48])" uses shading rate attachment with tile height ",
                       local_348 + 1,(char (*) [36])" that is not in the allowed range [",
                       pSStack_58->MinTileSize + 1,(char (*) [3])0xf64f1c,
                       pSStack_58->MaxTileSize + 1,
                       (char (*) [67])
                       "]. Check MinTileSize/MaxTileSize members of ShadingRateProperties.");
          }
          if (*local_348 != local_348[1]) {
            lVar42._0_4_ = DeviceInfo_local->Type;
            lVar42._4_4_ = (DeviceInfo_local->APIVersion).Major;
            if (lVar42 == 0) {
              local_648 = "";
            }
            else {
              local_648 = *(char **)DeviceInfo_local;
            }
            local_360 = local_648;
            LogError<true,char[29],char_const*,char[15],char[9],unsigned_int,char[47],unsigned_int,char[39],unsigned_int,char[2]>
                      (false,"ValidateRenderPassDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                       ,0x18d,(char (*) [29])"Description of render pass \'",&local_360,
                       (char (*) [15])"\' is invalid: ",(char (*) [9])0xf547e1,
                       (uint *)((long)&Subpass + 4),
                       (char (*) [47])" uses shading rate attachment with tile width ",local_348,
                       (char (*) [39])" that is not equal to the tile height ",local_348 + 1,
                       (char (*) [2])0xf544de);
          }
          bVar49 = IsPowerOfTwo<unsigned_int>(*local_348);
          if ((!bVar49) ||
             (bVar49 = IsPowerOfTwo<unsigned_int>(local_348[1]), lVar52 = extraout_RDX_30, !bVar49))
          {
            lVar43._0_4_ = DeviceInfo_local->Type;
            lVar43._4_4_ = (DeviceInfo_local->APIVersion).Major;
            if (lVar43 == 0) {
              local_650 = "";
            }
            else {
              local_650 = *(char **)DeviceInfo_local;
            }
            _subpass_1 = local_650;
            Subpass_1._7_1_ = 0x78;
            LogError<true,char[29],char_const*,char[15],char[9],unsigned_int,char[47],unsigned_int,char,unsigned_int,char[31]>
                      (false,"ValidateRenderPassDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                       ,0x192,(char (*) [29])"Description of render pass \'",(char **)&subpass_1,
                       (char (*) [15])"\' is invalid: ",(char (*) [9])0xf547e1,
                       (uint *)((long)&Subpass + 4),
                       (char (*) [47])" uses shading rate attachment with tile sizes ",local_348,
                       (char *)((long)&Subpass_1 + 7),local_348 + 1,
                       (char (*) [31])" that are not a powers of two.");
            lVar52 = extraout_RDX_31;
          }
        }
      }
    }
  }
  if ((pSStack_170 != (ShadingRateAttachment *)0x0) &&
     (SVar50 = operator&(pSStack_58->CapFlags,
                         SHADING_RATE_CAP_FLAG_SAME_TEXTURE_FOR_WHOLE_RENDERPASS),
     SVar50 != SHADING_RATE_CAP_FLAG_NONE)) {
    for (Subpass_1._0_4_ = 0; uVar2._0_1_ = (DeviceInfo_local->Features).TimestampQueries,
        uVar2._1_1_ = (DeviceInfo_local->Features).PipelineStatisticsQueries,
        uVar2._2_1_ = (DeviceInfo_local->Features).DurationQueries,
        uVar2._3_1_ = (DeviceInfo_local->Features).DepthBiasClamp, (uint)Subpass_1 < uVar2;
        Subpass_1._0_4_ = (uint)Subpass_1 + 1) {
      lVar52 = *(long *)&(DeviceInfo_local->Features).TextureCompressionBC;
      pacVar51 = (char (*) [12])((ulong)(uint)Subpass_1 * 0x48);
      Args_1 = pacVar51;
      if (*(long *)(pacVar51[5] + lVar52 + 4) == 0) {
        lVar44._0_4_ = DeviceInfo_local->Type;
        lVar44._4_4_ = (DeviceInfo_local->APIVersion).Major;
        if (lVar44 == 0) {
          local_658 = "";
        }
        else {
          local_658 = *(char **)DeviceInfo_local;
        }
        msg.field_2._8_8_ = local_658;
        Args_1 = (char (*) [12])0x1a3;
        LogError<true,char[29],char_const*,char[15],char[57],unsigned_int,char[198]>
                  (false,"ValidateRenderPassDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                   ,0x1a3,(char (*) [29])"Description of render pass \'",
                   (char **)((long)&msg.field_2 + 8),(char (*) [15])"\' is invalid: ",
                   (char (*) [57])"render pass uses a shading rate attachment, but subpass ",
                   (uint *)&Subpass_1,
                   (char (*) [198])
                   " uses no shading rate attachment. A device with SHADING_RATE_CAP_FLAG_SAME_TEXTURE_FOR_WHOLE_RENDERPASS capability requires that all subpasses of a render pass use the same shading rate attachment."
                  );
      }
      bVar49 = ShadingRateAttachment::operator!=
                         (*(ShadingRateAttachment **)(pacVar51[5] + lVar52 + 4),pSStack_170);
      if (bVar49) {
        if ((uint)Subpass_1 == 0) {
          FormatString<char[26],char[12]>
                    ((string *)local_3a0,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"subpass > 0",Args_1);
          Message = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (Message,"ValidateRenderPassDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                     ,0x1a8);
          std::__cxx11::string::~string((string *)local_3a0);
        }
        lVar45._0_4_ = DeviceInfo_local->Type;
        lVar45._4_4_ = (DeviceInfo_local->APIVersion).Major;
        if (lVar45 == 0) {
          local_668 = "";
        }
        else {
          local_668 = *(char **)DeviceInfo_local;
        }
        pcStack_3a8 = local_668;
        LogError<true,char[29],char_const*,char[15],char[36],unsigned_int,char[236]>
                  (false,"ValidateRenderPassDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                   ,0x1ac,(char (*) [29])"Description of render pass \'",&stack0xfffffffffffffc58,
                   (char (*) [15])"\' is invalid: ",(char (*) [36])0xf54e73,(uint *)&Subpass_1,
                   (char (*) [236])
                   " does not match the shading rate attachment used by previous subpasses. A device with SHADING_RATE_CAP_FLAG_SAME_TEXTURE_FOR_WHOLE_RENDERPASS capability requires that all subpasses of a render pass use the same shading rate attachment."
                  );
      }
    }
  }
  for (Dependency._4_4_ = 0; uVar3._0_1_ = (DeviceInfo_local->Features).ShaderInputOutput16,
      uVar3._1_1_ = (DeviceInfo_local->Features).ShaderInt8,
      uVar3._2_1_ = (DeviceInfo_local->Features).ResourceBuffer8BitAccess,
      uVar3._3_1_ = (DeviceInfo_local->Features).UniformBuffer8BitAccess, Dependency._4_4_ < uVar3;
      Dependency._4_4_ = Dependency._4_4_ + 1) {
    local_3b8 = *(long *)&(DeviceInfo_local->Features).NativeFence + (ulong)Dependency._4_4_ * 0x18;
    if (*(int *)(local_3b8 + 8) == 0) {
      lVar46._0_4_ = DeviceInfo_local->Type;
      lVar46._4_4_ = (DeviceInfo_local->APIVersion).Major;
      if (lVar46 == 0) {
        local_670 = "";
      }
      else {
        local_670 = *(char **)DeviceInfo_local;
      }
      local_3c0 = local_670;
      LogError<true,char[29],char_const*,char[15],char[45],unsigned_int,char[15]>
                (false,"ValidateRenderPassDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                 ,0x1b7,(char (*) [29])"Description of render pass \'",&local_3c0,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [45])"the source stage mask of subpass dependency ",
                 (uint *)((long)&Dependency + 4),(char (*) [15])0xf55a14);
    }
    if (*(int *)(local_3b8 + 0xc) == 0) {
      lVar47._0_4_ = DeviceInfo_local->Type;
      lVar47._4_4_ = (DeviceInfo_local->APIVersion).Major;
      if (lVar47 == 0) {
        local_678 = "";
      }
      else {
        local_678 = *(char **)DeviceInfo_local;
      }
      local_3c8 = local_678;
      LogError<true,char[29],char_const*,char[15],char[50],unsigned_int,char[15]>
                (false,"ValidateRenderPassDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderPassBase.cpp"
                 ,0x1bb,(char (*) [29])"Description of render pass \'",&local_3c8,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [50])"the destination stage mask of subpass dependency ",
                 (uint *)((long)&Dependency + 4),(char (*) [15])0xf55a14);
    }
  }
  return;
}

Assistant:

void ValidateRenderPassDesc(const RenderPassDesc&      Desc,
                            const RenderDeviceInfo&    DeviceInfo,
                            const GraphicsAdapterInfo& AdapterInfo) noexcept(false)
{
#define LOG_RENDER_PASS_ERROR_AND_THROW(...) LOG_ERROR_AND_THROW("Description of render pass '", (Desc.Name ? Desc.Name : ""), "' is invalid: ", ##__VA_ARGS__)

    const DeviceFeatures&        Features = DeviceInfo.Features;
    const ShadingRateProperties& SRProps  = AdapterInfo.ShadingRate;
    const bool                   IsVulkan = DeviceInfo.IsVulkanDevice();

    if (Desc.AttachmentCount != 0 && Desc.pAttachments == nullptr)
    {
        // If attachmentCount is not 0, pAttachments must be a valid pointer to an
        // array of attachmentCount valid VkAttachmentDescription structures.
        // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkRenderPassCreateInfo-pAttachments-parameter
        LOG_RENDER_PASS_ERROR_AND_THROW("the attachment count (", Desc.AttachmentCount, ") is not zero, but pAttachments is null.");
    }

    if (Desc.SubpassCount == 0)
    {
        // subpassCount must be greater than 0.
        // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkRenderPassCreateInfo-subpassCount-arraylength
        LOG_RENDER_PASS_ERROR_AND_THROW("render pass must have at least one subpass.");
    }
    if (Desc.pSubpasses == nullptr)
    {
        // pSubpasses must be a valid pointer to an array of subpassCount valid VkSubpassDescription structures.
        // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkRenderPassCreateInfo-pSubpasses-parameter
        LOG_RENDER_PASS_ERROR_AND_THROW("pSubpasses must not be null.");
    }

    if (Desc.DependencyCount != 0 && Desc.pDependencies == nullptr)
    {
        // If dependencyCount is not 0, pDependencies must be a valid pointer to an array of
        // dependencyCount valid VkSubpassDependency structures.
        // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkRenderPassCreateInfo-pDependencies-parameter
        LOG_RENDER_PASS_ERROR_AND_THROW("the dependency count (", Desc.DependencyCount, ") is not zero, but pDependencies is null.");
    }

    for (Uint32 i = 0; i < Desc.AttachmentCount; ++i)
    {
        const RenderPassAttachmentDesc& Attachment = Desc.pAttachments[i];
        if (Attachment.Format == TEX_FORMAT_UNKNOWN)
            LOG_RENDER_PASS_ERROR_AND_THROW("the format of attachment ", i, " is unknown.");

        if (Attachment.SampleCount == 0)
            LOG_RENDER_PASS_ERROR_AND_THROW("the sample count of attachment ", i, " is zero.");

        if (!IsPowerOfTwo(Attachment.SampleCount))
            LOG_RENDER_PASS_ERROR_AND_THROW("the sample count (", Uint32{Attachment.SampleCount}, ") of attachment ", i, " is not power of two.");

        const TextureFormatAttribs& FmtInfo = GetTextureFormatAttribs(Attachment.Format);
        if (FmtInfo.ComponentType == COMPONENT_TYPE_DEPTH ||
            FmtInfo.ComponentType == COMPONENT_TYPE_DEPTH_STENCIL)
        {
            if (Attachment.InitialState != RESOURCE_STATE_DEPTH_WRITE &&
                Attachment.InitialState != RESOURCE_STATE_DEPTH_READ &&
                Attachment.InitialState != RESOURCE_STATE_UNORDERED_ACCESS &&
                Attachment.InitialState != RESOURCE_STATE_SHADER_RESOURCE &&
                Attachment.InitialState != RESOURCE_STATE_RESOLVE_DEST &&
                Attachment.InitialState != RESOURCE_STATE_RESOLVE_SOURCE &&
                Attachment.InitialState != RESOURCE_STATE_COPY_DEST &&
                Attachment.InitialState != RESOURCE_STATE_COPY_SOURCE &&
                Attachment.InitialState != RESOURCE_STATE_INPUT_ATTACHMENT &&
                Attachment.InitialState != RESOURCE_STATE_UNDEFINED &&
                !(IsVulkan && Attachment.InitialState == RESOURCE_STATE_COMMON))
            {
                LOG_RENDER_PASS_ERROR_AND_THROW("the initial state of depth-stencil attachment ", i, " (", GetResourceStateString(Attachment.InitialState), ") is invalid.");
            }

            if (Attachment.FinalState != RESOURCE_STATE_DEPTH_WRITE &&
                Attachment.FinalState != RESOURCE_STATE_DEPTH_READ &&
                Attachment.FinalState != RESOURCE_STATE_UNORDERED_ACCESS &&
                Attachment.FinalState != RESOURCE_STATE_SHADER_RESOURCE &&
                Attachment.FinalState != RESOURCE_STATE_RESOLVE_DEST &&
                Attachment.FinalState != RESOURCE_STATE_RESOLVE_SOURCE &&
                Attachment.FinalState != RESOURCE_STATE_COPY_DEST &&
                Attachment.FinalState != RESOURCE_STATE_COPY_SOURCE &&
                Attachment.FinalState != RESOURCE_STATE_INPUT_ATTACHMENT &&
                !(IsVulkan && Attachment.FinalState == RESOURCE_STATE_COMMON))
            {
                LOG_RENDER_PASS_ERROR_AND_THROW("the final state of depth-stencil attachment ", i, " (", GetResourceStateString(Attachment.FinalState), ") is invalid.");
            }
        }
        else
        {
            if (Attachment.InitialState != RESOURCE_STATE_RENDER_TARGET &&
                Attachment.InitialState != RESOURCE_STATE_UNORDERED_ACCESS &&
                Attachment.InitialState != RESOURCE_STATE_SHADER_RESOURCE &&
                Attachment.InitialState != RESOURCE_STATE_RESOLVE_DEST &&
                Attachment.InitialState != RESOURCE_STATE_RESOLVE_SOURCE &&
                Attachment.InitialState != RESOURCE_STATE_COPY_SOURCE &&
                Attachment.InitialState != RESOURCE_STATE_COPY_DEST &&
                Attachment.InitialState != RESOURCE_STATE_INPUT_ATTACHMENT &&
                Attachment.InitialState != RESOURCE_STATE_PRESENT &&
                Attachment.InitialState != RESOURCE_STATE_SHADING_RATE &&
                Attachment.InitialState != RESOURCE_STATE_UNDEFINED &&
                !(IsVulkan && Attachment.InitialState == RESOURCE_STATE_COMMON))
            {
                LOG_RENDER_PASS_ERROR_AND_THROW("the initial state of color attachment ", i, " (", GetResourceStateString(Attachment.InitialState), ") is invalid.");
            }

            if (Attachment.FinalState != RESOURCE_STATE_RENDER_TARGET &&
                Attachment.FinalState != RESOURCE_STATE_UNORDERED_ACCESS &&
                Attachment.FinalState != RESOURCE_STATE_SHADER_RESOURCE &&
                Attachment.FinalState != RESOURCE_STATE_RESOLVE_DEST &&
                Attachment.FinalState != RESOURCE_STATE_RESOLVE_SOURCE &&
                Attachment.FinalState != RESOURCE_STATE_COPY_SOURCE &&
                Attachment.FinalState != RESOURCE_STATE_COPY_DEST &&
                Attachment.FinalState != RESOURCE_STATE_INPUT_ATTACHMENT &&
                Attachment.FinalState != RESOURCE_STATE_PRESENT &&
                Attachment.FinalState != RESOURCE_STATE_SHADING_RATE &&
                !(IsVulkan && Attachment.FinalState == RESOURCE_STATE_COMMON))
            {
                LOG_RENDER_PASS_ERROR_AND_THROW("the final state of color attachment ", i, " (", GetResourceStateString(Attachment.FinalState), ") is invalid.");
            }
        }
    }

    const ShadingRateAttachment* pShadingRateAttachment = nullptr;
    for (Uint32 subpass = 0; subpass < Desc.SubpassCount; ++subpass)
    {
        const SubpassDesc& Subpass = Desc.pSubpasses[subpass];
        if (Subpass.InputAttachmentCount != 0 && Subpass.pInputAttachments == nullptr)
        {
            LOG_RENDER_PASS_ERROR_AND_THROW("the input attachment count (", Subpass.InputAttachmentCount, ") of subpass ", subpass,
                                            " is not zero, while pInputAttachments is null.");
        }
        if (Subpass.RenderTargetAttachmentCount != 0 && Subpass.pRenderTargetAttachments == nullptr)
        {
            LOG_RENDER_PASS_ERROR_AND_THROW("the render target attachment count (", Subpass.RenderTargetAttachmentCount, ") of subpass ", subpass,
                                            " is not zero, while pRenderTargetAttachments is null.");
        }
        if (Subpass.PreserveAttachmentCount != 0 && Subpass.pPreserveAttachments == nullptr)
        {
            LOG_RENDER_PASS_ERROR_AND_THROW("the preserve attachment count (", Subpass.PreserveAttachmentCount, ") of subpass ", subpass,
                                            " is not zero, while pPreserveAttachments is null.");
        }

        for (Uint32 input_attachment = 0; input_attachment < Subpass.InputAttachmentCount; ++input_attachment)
        {
            const AttachmentReference& AttchRef = Subpass.pInputAttachments[input_attachment];
            if (AttchRef.AttachmentIndex == ATTACHMENT_UNUSED)
                continue;

            // If the attachment member of any element of pInputAttachments, pColorAttachments, pResolveAttachments
            // or pDepthStencilAttachment, or any element of pPreserveAttachments in any element of pSubpasses is not
            // VK_ATTACHMENT_UNUSED, it must be less than attachmentCount
            // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkRenderPassCreateInfo-attachment-00834
            if (AttchRef.AttachmentIndex >= Desc.AttachmentCount)
            {
                LOG_RENDER_PASS_ERROR_AND_THROW("the attachment index (", AttchRef.AttachmentIndex, ") of input attachment reference ", input_attachment,
                                                " of subpass ", subpass, " must be less than the number of attachments (", Desc.AttachmentCount, ").");
            }

            if (!(AttchRef.State == RESOURCE_STATE_INPUT_ATTACHMENT || (IsVulkan && AttchRef.State == RESOURCE_STATE_COMMON)))
            {
                LOG_RENDER_PASS_ERROR_AND_THROW("attachment with index ", AttchRef.AttachmentIndex, " referenced as input attachment in subpass ", subpass,
                                                " must be in ", (IsVulkan ? "INPUT_ATTACHMENT or COMMON" : "INPUT_ATTACHMENT"), " state, but specified state is ",
                                                GetResourceStateString(AttchRef.State));
            }
        }

        for (Uint32 rt_attachment = 0; rt_attachment < Subpass.RenderTargetAttachmentCount; ++rt_attachment)
        {
            const AttachmentReference& AttchRef = Subpass.pRenderTargetAttachments[rt_attachment];
            if (AttchRef.AttachmentIndex == ATTACHMENT_UNUSED)
                continue;

            // If the attachment member of any element of pInputAttachments, pColorAttachments, pResolveAttachments
            // or pDepthStencilAttachment, or any element of pPreserveAttachments in any element of pSubpasses is not
            // VK_ATTACHMENT_UNUSED, it must be less than attachmentCount
            // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkRenderPassCreateInfo-attachment-00834
            if (AttchRef.AttachmentIndex >= Desc.AttachmentCount)
            {
                LOG_RENDER_PASS_ERROR_AND_THROW("the attachment index (", AttchRef.AttachmentIndex, ") of render target attachment reference ", rt_attachment,
                                                " of subpass ", subpass, " must be less than the number of attachments (", Desc.AttachmentCount, ").");
            }

            if (!(AttchRef.State == RESOURCE_STATE_RENDER_TARGET || (IsVulkan && AttchRef.State == RESOURCE_STATE_COMMON)))
            {
                LOG_RENDER_PASS_ERROR_AND_THROW("attachment with index ", AttchRef.AttachmentIndex, " referenced as render target attachment in subpass ", subpass,
                                                " must be in ", (IsVulkan ? "RENDER_TARGET or COMMON" : "RENDER_TARGET"), " state, but specified state is ",
                                                GetResourceStateString(AttchRef.State));
            }

            const TEXTURE_FORMAT        Fmt        = Desc.pAttachments[AttchRef.AttachmentIndex].Format;
            const TextureFormatAttribs& FmtAttribs = GetTextureFormatAttribs(Fmt);
            if (FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH ||
                FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH_STENCIL ||
                FmtAttribs.ComponentType == COMPONENT_TYPE_COMPRESSED)
            {
                LOG_RENDER_PASS_ERROR_AND_THROW("attachment with index ", AttchRef.AttachmentIndex, " referenced as render target attachment in subpass ", subpass,
                                                " uses format ", FmtAttribs.Name, ", which is not a valid render target format.");
            }
        }

        if (Subpass.pResolveAttachments != nullptr)
        {
            for (Uint32 rslv_attachment = 0; rslv_attachment < Subpass.RenderTargetAttachmentCount; ++rslv_attachment)
            {
                const AttachmentReference& AttchRef = Subpass.pResolveAttachments[rslv_attachment];
                if (AttchRef.AttachmentIndex == ATTACHMENT_UNUSED)
                    continue;

                // If the attachment member of any element of pInputAttachments, pColorAttachments, pResolveAttachments
                // or pDepthStencilAttachment, or any element of pPreserveAttachments in any element of pSubpasses is not
                // VK_ATTACHMENT_UNUSED, it must be less than attachmentCount
                // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkRenderPassCreateInfo-attachment-00834
                if (AttchRef.AttachmentIndex >= Desc.AttachmentCount)
                {
                    LOG_RENDER_PASS_ERROR_AND_THROW("the attachment index (", AttchRef.AttachmentIndex, ") of resolve attachment reference ", rslv_attachment,
                                                    " of subpass ", subpass, " must be less than the number of attachments (", Desc.AttachmentCount, ").");
                }
            }
        }

        if (Subpass.pDepthStencilAttachment != nullptr)
        {
            const AttachmentReference& AttchRef = *Subpass.pDepthStencilAttachment;
            if (AttchRef.AttachmentIndex != ATTACHMENT_UNUSED)
            {
                // If the attachment member of any element of pInputAttachments, pColorAttachments, pResolveAttachments
                // or pDepthStencilAttachment, or any element of pPreserveAttachments in any element of pSubpasses is not
                // VK_ATTACHMENT_UNUSED, it must be less than attachmentCount
                // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkRenderPassCreateInfo-attachment-00834
                if (AttchRef.AttachmentIndex >= Desc.AttachmentCount)
                {
                    LOG_RENDER_PASS_ERROR_AND_THROW("the attachment index (", AttchRef.AttachmentIndex, ") of depth-stencil attachment reference of subpass ", subpass,
                                                    " must be less than the number of attachments (", Desc.AttachmentCount, ").");
                }

                if (!(AttchRef.State == RESOURCE_STATE_DEPTH_READ || AttchRef.State == RESOURCE_STATE_DEPTH_WRITE || (IsVulkan && AttchRef.State == RESOURCE_STATE_COMMON)))
                {
                    LOG_RENDER_PASS_ERROR_AND_THROW("attachment with index ", AttchRef.AttachmentIndex, " referenced as depth stencil attachment in subpass ", subpass,
                                                    " must be in ", (IsVulkan ? "DEPTH_READ, DEPTH_WRITE or COMMON" : "DEPTH_READ or DEPTH_WRITE"),
                                                    " state, but specified state is ", GetResourceStateString(AttchRef.State));
                }

                const TEXTURE_FORMAT        Fmt        = Desc.pAttachments[AttchRef.AttachmentIndex].Format;
                const TextureFormatAttribs& FmtAttribs = GetTextureFormatAttribs(Fmt);
                if (FmtAttribs.ComponentType != COMPONENT_TYPE_DEPTH &&
                    FmtAttribs.ComponentType != COMPONENT_TYPE_DEPTH_STENCIL)
                {
                    LOG_RENDER_PASS_ERROR_AND_THROW("attachment with index ", AttchRef.AttachmentIndex, " referenced as depth-stencil attachment in subpass ", subpass,
                                                    " uses format ", FmtAttribs.Name, ", which is not a valid depth buffer format.");
                }
            }
        }

        for (Uint32 prsv_attachment = 0; prsv_attachment < Subpass.PreserveAttachmentCount; ++prsv_attachment)
        {
            const Uint32 PrsvAttachment = Subpass.pPreserveAttachments[prsv_attachment];
            if (PrsvAttachment == ATTACHMENT_UNUSED)
            {
                // The attachment member of each element of pPreserveAttachments must not be VK_ATTACHMENT_UNUSED
                // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkSubpassDescription-attachment-00853
                LOG_RENDER_PASS_ERROR_AND_THROW("the attachment index of preserve attachment reference ", prsv_attachment,
                                                " of subpass ", subpass, " is ATTACHMENT_UNUSED.");
            }

            if (PrsvAttachment >= Desc.AttachmentCount)
            {
                LOG_RENDER_PASS_ERROR_AND_THROW("the attachment index (", PrsvAttachment, ") of preserve attachment reference ", prsv_attachment,
                                                " of subpass ", subpass, " exceeds the number of attachments (", Desc.AttachmentCount, ").");
            }
        }

        if (Subpass.pResolveAttachments != nullptr)
        {
            for (Uint32 attchmnt = 0; attchmnt < Subpass.RenderTargetAttachmentCount; ++attchmnt)
            {
                const AttachmentReference& RTAttachmentRef   = Subpass.pRenderTargetAttachments[attchmnt];
                const AttachmentReference& RslvAttachmentRef = Subpass.pResolveAttachments[attchmnt];
                if (RslvAttachmentRef.AttachmentIndex != ATTACHMENT_UNUSED && RTAttachmentRef.AttachmentIndex == ATTACHMENT_UNUSED)
                {
                    // If pResolveAttachments is not NULL, for each resolve attachment that is not VK_ATTACHMENT_UNUSED,
                    // the corresponding color attachment must not be VK_ATTACHMENT_UNUSED
                    // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkSubpassDescription-pResolveAttachments-00847
                    LOG_RENDER_PASS_ERROR_AND_THROW("pResolveAttachments of subpass ", subpass, " is not null and resolve attachment reference ", attchmnt,
                                                    " is not ATTACHMENT_UNUSED, but corresponding render target attachment reference is ATTACHMENT_UNUSED.");
                }

                if (RslvAttachmentRef.AttachmentIndex != ATTACHMENT_UNUSED && Desc.pAttachments[RTAttachmentRef.AttachmentIndex].SampleCount == 1)
                {
                    // If pResolveAttachments is not NULL, for each resolve attachment that is not VK_ATTACHMENT_UNUSED,
                    // the corresponding color attachment must not have a sample count of VK_SAMPLE_COUNT_1_BIT
                    // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkSubpassDescription-pResolveAttachments-00848
                    LOG_RENDER_PASS_ERROR_AND_THROW("Render target attachment at index ", RTAttachmentRef.AttachmentIndex, " referenced by",
                                                    " attachment reference ", attchmnt, " of subpass ", subpass,
                                                    " is used as the source of resolve operation, but its sample count is 1.");
                }

                if (RslvAttachmentRef.AttachmentIndex != ATTACHMENT_UNUSED && Desc.pAttachments[RslvAttachmentRef.AttachmentIndex].SampleCount != 1)
                {
                    // If pResolveAttachments is not NULL, each resolve attachment that is not VK_ATTACHMENT_UNUSED must
                    // have a sample count of VK_SAMPLE_COUNT_1_BIT
                    // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkSubpassDescription-pResolveAttachments-00849
                    LOG_RENDER_PASS_ERROR_AND_THROW("Resolve attachment at index ", RslvAttachmentRef.AttachmentIndex, " referenced by",
                                                    " attachment reference ", attchmnt, " of subpass ", subpass,
                                                    " must have sample count of 1.");
                }

                if (RTAttachmentRef.AttachmentIndex != ATTACHMENT_UNUSED && RslvAttachmentRef.AttachmentIndex != ATTACHMENT_UNUSED &&
                    Desc.pAttachments[RTAttachmentRef.AttachmentIndex].Format != Desc.pAttachments[RslvAttachmentRef.AttachmentIndex].Format)
                {
                    // If pResolveAttachments is not NULL, each resolve attachment that is not VK_ATTACHMENT_UNUSED
                    // must have the same VkFormat as its corresponding color attachment.
                    // https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-VkSubpassDescription-pResolveAttachments-00850
                    LOG_RENDER_PASS_ERROR_AND_THROW("The format (",
                                                    GetTextureFormatAttribs(Desc.pAttachments[RTAttachmentRef.AttachmentIndex].Format).Name,
                                                    ") of render target attachment at index ", RTAttachmentRef.AttachmentIndex,
                                                    " referenced by attachment reference ", attchmnt, " of subpass ", subpass,
                                                    " does not match the format (",
                                                    GetTextureFormatAttribs(Desc.pAttachments[RslvAttachmentRef.AttachmentIndex].Format).Name,
                                                    ") of the corresponding resolve attachment at index ",
                                                    RslvAttachmentRef.AttachmentIndex, ".");
                }
            }
        }

        if (Subpass.pShadingRateAttachment != nullptr)
        {
            pShadingRateAttachment              = pShadingRateAttachment != nullptr ? pShadingRateAttachment : Subpass.pShadingRateAttachment;
            const AttachmentReference& AttchRef = Subpass.pShadingRateAttachment->Attachment;
            if (AttchRef.AttachmentIndex != ATTACHMENT_UNUSED)
            {
                if (AttchRef.AttachmentIndex >= Desc.AttachmentCount)
                {
                    LOG_RENDER_PASS_ERROR_AND_THROW("the attachment index (", AttchRef.AttachmentIndex, ") of shading rate attachment reference of subpass ", subpass,
                                                    " must be less than the number of attachments (", Desc.AttachmentCount, ").");
                }

                if (!Features.VariableRateShading)
                    LOG_RENDER_PASS_ERROR_AND_THROW("subpass ", subpass, " uses a shading rate attachment, but VariableRateShading device feature is not enabled");

                if (AttchRef.State != RESOURCE_STATE_SHADING_RATE)
                {
                    LOG_RENDER_PASS_ERROR_AND_THROW("attachment with index ", AttchRef.AttachmentIndex, " referenced as shading rate attachment in subpass ", subpass,
                                                    " must be in SHADING_RATE state, but specified state is ", GetResourceStateString(AttchRef.State));
                }

                const auto& TileSize = Subpass.pShadingRateAttachment->TileSize;
                if (TileSize[0] != 0 || TileSize[1] != 0)
                {
                    if (TileSize[0] < SRProps.MinTileSize[0] || TileSize[0] > SRProps.MaxTileSize[0])
                    {
                        LOG_RENDER_PASS_ERROR_AND_THROW("subpass ", subpass, " uses shading rate attachment with tile width ", TileSize[0],
                                                        " that is not in the allowed range [", SRProps.MinTileSize[0], ", ", SRProps.MaxTileSize[0],
                                                        "]. Check MinTileSize/MaxTileSize members of ShadingRateProperties.");
                    }
                    if (TileSize[1] < SRProps.MinTileSize[1] || TileSize[1] > SRProps.MaxTileSize[1])
                    {
                        LOG_RENDER_PASS_ERROR_AND_THROW("subpass ", subpass, " uses shading rate attachment with tile height ", TileSize[1],
                                                        " that is not in the allowed range [", SRProps.MinTileSize[1], ", ", SRProps.MaxTileSize[1],
                                                        "]. Check MinTileSize/MaxTileSize members of ShadingRateProperties.");
                    }
                    if (TileSize[0] != TileSize[1])
                    {
                        // The tile size is only used for Vulkan shading rate and current hardware only supports aspect ratio of 1.
                        // TODO: use VkPhysicalDeviceFragmentShadingRatePropertiesKHR::maxFragmentShadingRateAttachmentTexelSizeAspectRatio
                        LOG_RENDER_PASS_ERROR_AND_THROW("subpass ", subpass, " uses shading rate attachment with tile width ", TileSize[0], " that is not equal to the tile height ", TileSize[1], ".");
                    }
                    if (!IsPowerOfTwo(TileSize[0]) || !IsPowerOfTwo(TileSize[1]))
                    {
                        LOG_RENDER_PASS_ERROR_AND_THROW("subpass ", subpass, " uses shading rate attachment with tile sizes ", TileSize[0], 'x', TileSize[1],
                                                        " that are not a powers of two.");
                    }
                }
            }
        }
    }

    if (pShadingRateAttachment != nullptr && (SRProps.CapFlags & SHADING_RATE_CAP_FLAG_SAME_TEXTURE_FOR_WHOLE_RENDERPASS) != SHADING_RATE_CAP_FLAG_NONE)
    {
        for (Uint32 subpass = 0; subpass < Desc.SubpassCount; ++subpass)
        {
            const SubpassDesc& Subpass = Desc.pSubpasses[subpass];

            if (Subpass.pShadingRateAttachment == nullptr)
            {
                LOG_RENDER_PASS_ERROR_AND_THROW("render pass uses a shading rate attachment, but subpass ", subpass,
                                                " uses no shading rate attachment. A device with SHADING_RATE_CAP_FLAG_SAME_TEXTURE_FOR_WHOLE_RENDERPASS "
                                                "capability requires that all subpasses of a render pass use the same shading rate attachment.");
            }

            if (*Subpass.pShadingRateAttachment != *pShadingRateAttachment)
            {
                VERIFY_EXPR(subpass > 0);
                LOG_RENDER_PASS_ERROR_AND_THROW("shading rate attachment in subpass ", subpass,
                                                " does not match the shading rate attachment used by previous subpasses. "
                                                "A device with SHADING_RATE_CAP_FLAG_SAME_TEXTURE_FOR_WHOLE_RENDERPASS capability "
                                                "requires that all subpasses of a render pass use the same shading rate attachment.");
            }
        }
    }

    for (Uint32 i = 0; i < Desc.DependencyCount; ++i)
    {
        const SubpassDependencyDesc& Dependency = Desc.pDependencies[i];

        if (Dependency.SrcStageMask == PIPELINE_STAGE_FLAG_UNDEFINED)
        {
            LOG_RENDER_PASS_ERROR_AND_THROW("the source stage mask of subpass dependency ", i, " is undefined.");
        }
        if (Dependency.DstStageMask == PIPELINE_STAGE_FLAG_UNDEFINED)
        {
            LOG_RENDER_PASS_ERROR_AND_THROW("the destination stage mask of subpass dependency ", i, " is undefined.");
        }
    }
}